

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O2

void __thiscall HEkkDual::initialiseSolve(HEkkDual *this)

{
  int *piVar1;
  HEkk *pHVar2;
  HighsOptions *pHVar3;
  double dVar4;
  double dVar5;
  ulong uVar6;
  ulong uVar7;
  
  pHVar2 = this->ekk_instance_;
  pHVar3 = pHVar2->options_;
  this->objective_bound = (pHVar3->super_HighsOptionsStruct).objective_bound;
  dVar4 = (pHVar3->super_HighsOptionsStruct).primal_feasibility_tolerance;
  dVar5 = (pHVar3->super_HighsOptionsStruct).dual_feasibility_tolerance;
  this->dual_feasibility_tolerance = dVar5;
  this->Tp = dVar4;
  this->primal_feasibility_tolerance = dVar4;
  this->Td = dVar5;
  this->initial_basis_is_logical_ = true;
  uVar7 = 0;
  uVar6 = (ulong)(uint)this->solver_num_row;
  if (this->solver_num_row < 1) {
    uVar6 = uVar7;
  }
  do {
    if (uVar6 == uVar7) goto LAB_0033708f;
    piVar1 = (pHVar2->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + uVar7;
    uVar7 = uVar7 + 1;
  } while (this->solver_num_col <= *piVar1);
  this->initial_basis_is_logical_ = false;
LAB_0033708f:
  interpretDualEdgeWeightStrategy(this,(pHVar2->info_).dual_edge_weight_strategy);
  pHVar2 = this->ekk_instance_;
  pHVar2->model_status_ = kMin;
  pHVar2->solve_bailout_ = false;
  pHVar2->called_return_from_solve_ = false;
  pHVar2->exit_algorithm_ = kDual;
  this->rebuild_reason = 0;
  return;
}

Assistant:

void HEkkDual::initialiseSolve() {
  // Copy values of simplex solver options to dual simplex options
  primal_feasibility_tolerance =
      ekk_instance_.options_->primal_feasibility_tolerance;
  dual_feasibility_tolerance =
      ekk_instance_.options_->dual_feasibility_tolerance;
  objective_bound = ekk_instance_.options_->objective_bound;

  // Copy tolerances
  // ToDo: Eliminate these horribly-named unnecessary copies!
  Tp = primal_feasibility_tolerance;
  Td = dual_feasibility_tolerance;

  initial_basis_is_logical_ = true;
  for (HighsInt iRow = 0; iRow < solver_num_row; iRow++) {
    if (ekk_instance_.basis_.basicIndex_[iRow] < solver_num_col) {
      initial_basis_is_logical_ = false;
      break;
    }
  }

  interpretDualEdgeWeightStrategy(
      ekk_instance_.info_.dual_edge_weight_strategy);

  // Initialise model and run status values
  ekk_instance_.model_status_ = HighsModelStatus::kNotset;
  ekk_instance_.solve_bailout_ = false;
  ekk_instance_.called_return_from_solve_ = false;
  ekk_instance_.exit_algorithm_ = SimplexAlgorithm::kDual;

  rebuild_reason = kRebuildReasonNo;
}